

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTestCaseAndSectionHeader(ConsoleReporter *this)

{
  bool bVar1;
  type tVar2;
  string *psVar3;
  ostream *poVar4;
  long in_RDI;
  Colour colourGuard_1;
  SourceLineInfo lineInfo;
  It itEnd;
  It it;
  ThreadedSectionInfo *section;
  vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_> sections;
  Colour colourGuard;
  undefined4 in_stack_fffffffffffffef8;
  Code in_stack_fffffffffffffefc;
  SourceLineInfo *in_stack_ffffffffffffff00;
  vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
  *in_stack_ffffffffffffff08;
  vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
  *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  ConsoleReporter *in_stack_ffffffffffffff20;
  size_t in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  ConsoleReporter *in_stack_ffffffffffffffc0;
  ThreadedSectionInfo *local_30;
  
  Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)(in_RDI + 0x78));
  printOpenHeader(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  tVar2 = Catch::Ptr::operator_cast_to_function_pointer((Ptr<Catch::ThreadedSectionInfo> *)0x1c5cf3)
  ;
  if (tVar2 != 0) {
    Colour::Colour((Colour *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::vector
              ((vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
                *)0x1c5d1c);
    for (local_30 = Ptr<Catch::ThreadedSectionInfo>::get
                              ((Ptr<Catch::ThreadedSectionInfo> *)(in_RDI + 0x160));
        local_30 != (ThreadedSectionInfo *)0x0; local_30 = local_30->parent) {
      std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::
      push_back(in_stack_ffffffffffffff10,(value_type *)in_stack_ffffffffffffff08);
    }
    bVar1 = std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>
            ::empty(in_stack_ffffffffffffff10);
    if (!bVar1) {
      std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::
      rbegin(in_stack_ffffffffffffff08);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo*const*,std::vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>>>
      ::
      reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo**,std::vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                  *)in_stack_ffffffffffffff00,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_**,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::rend
                (in_stack_ffffffffffffff08);
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo*const*,std::vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>>>
      ::
      reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo**,std::vector<Catch::ThreadedSectionInfo*,std::allocator<Catch::ThreadedSectionInfo*>>>>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                  *)in_stack_ffffffffffffff00,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_**,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      while (bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                                      *)in_stack_ffffffffffffff00,
                                     (reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                                      *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8
                                                )), bVar1) {
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
        ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                     *)in_stack_ffffffffffffff00);
        printHeaderString(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                          in_stack_ffffffffffffffb0);
        std::
        reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
        ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<Catch::ThreadedSectionInfo_*const_*,_std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>_>_>
                      *)in_stack_ffffffffffffff00);
      }
    }
    std::vector<Catch::ThreadedSectionInfo_*,_std::allocator<Catch::ThreadedSectionInfo_*>_>::
    ~vector(in_stack_ffffffffffffff10);
    Colour::~Colour((Colour *)0x1c5e9d);
  }
  tVar2 = Catch::Ptr::operator_cast_to_function_pointer((Ptr<Catch::ThreadedSectionInfo> *)0x1c5eae)
  ;
  if (tVar2 == 0) {
    Option<Catch::TestCaseInfo>::operator->((Option<Catch::TestCaseInfo> *)(in_RDI + 0x78));
  }
  else {
    Ptr<Catch::ThreadedSectionInfo>::operator->((Ptr<Catch::ThreadedSectionInfo> *)(in_RDI + 0x160))
    ;
  }
  SourceLineInfo::SourceLineInfo
            (in_stack_ffffffffffffff00,
             (SourceLineInfo *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  bVar1 = SourceLineInfo::empty((SourceLineInfo *)0x1c5f0c);
  if (!bVar1) {
    poVar4 = *(ostream **)(in_RDI + 0x168);
    psVar3 = getDashes_abi_cxx11_();
    poVar4 = std::operator<<(poVar4,(string *)psVar3);
    std::operator<<(poVar4,"\n");
    Colour::Colour((Colour *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    poVar4 = operator<<((ostream *)in_stack_ffffffffffffff00,
                        (SourceLineInfo *)
                        CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    std::operator<<(poVar4,"\n");
    Colour::~Colour((Colour *)0x1c5fa8);
  }
  poVar4 = *(ostream **)(in_RDI + 0x168);
  psVar3 = getDots_abi_cxx11_();
  poVar4 = std::operator<<(poVar4,(string *)psVar3);
  poVar4 = std::operator<<(poVar4,"\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  SourceLineInfo::~SourceLineInfo((SourceLineInfo *)0x1c604e);
  return;
}

Assistant:

void printTestCaseAndSectionHeader() {
            printOpenHeader( unusedTestCaseInfo->name );
            if( currentSectionInfo ) {
                Colour colourGuard( Colour::Headers );
                std::vector<ThreadedSectionInfo*> sections;
                for(    ThreadedSectionInfo* section = currentSectionInfo.get();
                        section;
                        section = section->parent )
                    sections.push_back( section );

                // Sections
                if( !sections.empty() ) {
                    typedef std::vector<ThreadedSectionInfo*>::const_reverse_iterator It;
                    for( It it = sections.rbegin(), itEnd = sections.rend(); it != itEnd; ++it )
                        printHeaderString( (*it)->name, 2 );

                }
            }
            SourceLineInfo lineInfo = currentSectionInfo
                                    ? currentSectionInfo->lineInfo
                                    : unusedTestCaseInfo->lineInfo;

            if( !lineInfo.empty() ){
                stream << getDashes() << "\n";
                Colour colourGuard( Colour::FileName );
                stream << lineInfo << "\n";
            }
            stream << getDots() << "\n" << std::endl;
        }